

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

DdNode * cuddUniqueInterZdd(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  int *piVar1;
  DdSubtable *pDVar2;
  DdSubtable *pDVar3;
  DdNode *pDVar4;
  DdNode **ppDVar5;
  int iVar6;
  uint uVar7;
  _func_void_long *p_Var8;
  int iVar9;
  uint uVar10;
  DdNode **__s;
  ulong uVar11;
  DdNode *pDVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  
  if ((index < unique->sizeZ) || (iVar9 = cuddResizeTableZdd(unique,index), iVar9 != 0)) {
    pDVar3 = unique->subtableZ;
    uVar10 = unique->permZ[index];
    uVar11 = (ulong)uVar10;
    pDVar2 = pDVar3 + uVar11;
    if (pDVar3[uVar11].maxKeys < pDVar3[uVar11].keys) {
      if ((unique->gcEnabled == 0) ||
         ((unique->deadZ <= unique->minDead && (pDVar2->dead * 10 <= pDVar3[uVar11].keys * 9)))) {
        if (unique->looseUpTo < unique->slots) {
          unique->minDead = unique->slots;
          unique->gcFrac = 1.0;
        }
        p_Var8 = Extra_UtilMMoutOfMemory;
        if (uVar10 == 0x7fffffff) {
          __assert_fail("i != CUDD_MAXINDEX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/cudd/cuddTable.c"
                        ,0x98e,"void ddRehashZdd(DdManager *, int)");
        }
        uVar14 = pDVar3[(int)uVar10].slots;
        iVar9 = pDVar3[(int)uVar10].shift;
        ppDVar5 = pDVar3[(int)uVar10].nodelist;
        uVar15 = (ulong)uVar14;
        do {
          iVar6 = (int)uVar15;
          uVar7 = iVar6 * 2;
          uVar15 = (ulong)uVar7;
          iVar9 = iVar9 + -1;
          uVar16 = iVar6 << 3;
        } while (uVar16 < pDVar3[(int)uVar10].keys);
        Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
        __s = (DdNode **)malloc((ulong)uVar7 << 3);
        Extra_UtilMMoutOfMemory = p_Var8;
        if (__s == (DdNode **)0x0) {
          fprintf((FILE *)unique->err,"Unable to resize ZDD subtable %d for lack of memory.\n",
                  uVar11);
          cuddGarbageCollect(unique,1);
          iVar9 = unique->sizeZ;
          if (0 < (long)iVar9) {
            pDVar3 = unique->subtableZ;
            lVar13 = 0;
            do {
              piVar1 = (int *)((long)&pDVar3->maxKeys + lVar13);
              *piVar1 = *piVar1 << 1;
              lVar13 = lVar13 + 0x38;
            } while ((long)iVar9 * 0x38 - lVar13 != 0);
          }
        }
        else {
          pDVar3[(int)uVar10].nodelist = __s;
          pDVar3[(int)uVar10].slots = uVar7;
          pDVar3[(int)uVar10].shift = iVar9;
          pDVar3[(int)uVar10].maxKeys = uVar16;
          if (uVar7 != 0) {
            memset(__s,0,(ulong)uVar7 << 3);
          }
          if (uVar14 != 0) {
            uVar11 = 0;
            do {
              pDVar12 = ppDVar5[uVar11];
              while (pDVar12 != (DdNode *)0x0) {
                uVar15 = *(ulong *)((long)&pDVar12->type + 8);
                uVar10 = (((uint)uVar15 & 1) + *(int *)((uVar15 & 0xfffffffffffffffe) + 0x20) * 2 +
                         (((uint)*(ulong *)&pDVar12->type & 1) +
                         *(int *)((*(ulong *)&pDVar12->type & 0xfffffffffffffffe) + 0x20) * 2) *
                         0xc00005) * 0x40f1f9 >> ((byte)iVar9 & 0x1f);
                pDVar4 = pDVar12->next;
                pDVar12->next = __s[(int)uVar10];
                __s[(int)uVar10] = pDVar12;
                pDVar12 = pDVar4;
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar14);
          }
          if (ppDVar5 != (DdNode **)0x0) {
            free(ppDVar5);
          }
          unique->memused = unique->memused + (ulong)(uVar7 - uVar14) * 8;
          uVar14 = (uVar7 - uVar14) + unique->slots;
          unique->slots = uVar14;
          unique->minDead = (uint)(long)((double)uVar14 * unique->gcFrac);
          uVar10 = unique->maxCacheHard;
          if (uVar14 * 4 < unique->maxCacheHard) {
            uVar10 = uVar14 * 4;
          }
          iVar9 = uVar10 + unique->cacheSlots * -2;
          unique->cacheSlack = iVar9;
          if (-1 < iVar9 && unique->cacheSlots < uVar14 >> 1) {
            cuddCacheResize(unique);
          }
        }
      }
      else {
        cuddGarbageCollect(unique,1);
      }
    }
    uVar10 = (((uint)E & 1) + *(int *)(((ulong)E & 0xfffffffffffffffe) + 0x20) * 2 +
             (((uint)T & 1) + *(int *)(((ulong)T & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
             0x40f1f9 >> ((byte)pDVar2->shift & 0x1f);
    ppDVar5 = pDVar2->nodelist;
    for (pDVar12 = ppDVar5[(int)uVar10]; pDVar12 != (DdNode *)0x0; pDVar12 = pDVar12->next) {
      if (((pDVar12->type).kids.T == T) && ((pDVar12->type).kids.E == E)) {
        if (pDVar12->ref != 0) {
          return pDVar12;
        }
        cuddReclaimZdd(unique,pDVar12);
        return pDVar12;
      }
    }
    if ((unique->autoDynZ == 0) ||
       (unique->keysZ - (unique->countDead & unique->deadZ) < unique->nextDyn)) {
      unique->keysZ = unique->keysZ + 1;
      pDVar2->keys = pDVar2->keys + 1;
      pDVar12 = cuddAllocNode(unique);
      if (pDVar12 != (DdNode *)0x0) {
        pDVar12->index = index;
        (pDVar12->type).kids.T = T;
        (pDVar12->type).kids.E = E;
        pDVar12->next = ppDVar5[(int)uVar10];
        ppDVar5[(int)uVar10] = pDVar12;
        piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        return pDVar12;
      }
    }
    else {
      iVar9 = Cudd_zddReduceHeap(unique,unique->autoMethodZ,10);
      if (iVar9 == 0) {
        unique->reordered = 2;
      }
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddUniqueInterZdd(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    int pos;
    unsigned int level;
    int retval;
    DdNodePtr *nodelist;
    DdNode *looking;
    DdSubtable *subtable;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (index >= unique->sizeZ) {
        if (!cuddResizeTableZdd(unique,index)) return(NULL);
    }

    level = unique->permZ[index];
    subtable = &(unique->subtableZ[level]);

#ifdef DD_DEBUG
    assert(level < (unsigned) cuddIZ(unique,T->index));
    assert(level < (unsigned) cuddIZ(unique,Cudd_Regular(E)->index));
#endif

    if (subtable->keys > subtable->maxKeys) {
        if (unique->gcEnabled && ((unique->deadZ > unique->minDead) ||
        (10 * subtable->dead > 9 * subtable->keys))) {  /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            ddRehashZdd(unique,(int)level);
        }
    }

    pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
    nodelist = subtable->nodelist;
    looking = nodelist[pos];

    while (looking != NULL) {
        if (cuddT(looking) == T && cuddE(looking) == E) {
            if (looking->ref == 0) {
                cuddReclaimZdd(unique,looking);
            }
            return(looking);
        }
        looking = looking->next;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }

    /* countDead is 0 if deads should be counted and ~0 if they should not. */
    if (unique->autoDynZ &&
    unique->keysZ - (unique->deadZ & unique->countDead) >= unique->nextDyn) {
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) return(NULL);
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) return(NULL);
#endif
        retval = Cudd_zddReduceHeap(unique,unique->autoMethodZ,10); /* 10 = whatever */
        if (retval == 0) unique->reordered = 2;
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) unique->reordered = 2;
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) unique->reordered = 2;
#endif
        return(NULL);
    }

    unique->keysZ++;
    subtable->keys++;

    looking = cuddAllocNode(unique);
    if (looking == NULL) return(NULL);
    looking->index = index;
    cuddT(looking) = T;
    cuddE(looking) = E;
    looking->next = nodelist[pos];
    nodelist[pos] = looking;
    cuddRef(T);
    cuddRef(E);

    return(looking);

}